

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O1

uint_t flexfloat_denorm_frac(flexfloat_t *a,int_fast16_t exp)

{
  fp_t fVar1;
  uint_t uVar2;
  uint uVar3;
  
  fVar1 = a->value;
  if (((ulong)fVar1 & 0x7ff0000000000000) != 0) {
    uVar3 = 0x35 - ((int)exp + (uint)(a->desc).frac_bits);
    uVar2 = 0;
    if ((uVar3 & 0xffff) < 0x40) {
      uVar2 = ((ulong)fVar1 & 0xfffffffffffff) + 0x10000000000000 >> ((byte)uVar3 & 0x3f);
    }
    return uVar2;
  }
  return ((ulong)fVar1 & 0xfffffffffffff) >> (0x34 - (a->desc).frac_bits & 0x3f);
}

Assistant:

uint_t flexfloat_denorm_frac(const flexfloat_t *a, int_fast16_t exp)
{
    if(EXPONENT(CAST_TO_INT(a->value)) == 0) // Denormalized backend value
    {
        return (CAST_TO_INT(a->value) & MASK_FRAC) >> (NUM_BITS_FRAC - a->desc.frac_bits);
    }
    else // Denormalized target value (in normalized backend value)
    {
        unsigned short shift = NUM_BITS_FRAC - a->desc.frac_bits - exp + 1;
        if(shift >= NUM_BITS) return 0;
        return (((CAST_TO_INT(a->value) & MASK_FRAC) | MASK_FRAC_MSB) >> shift);
    }
}